

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O3

StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> * __thiscall
draco::Decoder::DecodePointCloudFromBuffer
          (StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
           *__return_storage_ptr__,Decoder *this,DecoderBuffer *in_buffer)

{
  Mesh *this_00;
  _Alloc_hider _Var1;
  Status _status;
  StatusOr<draco::EncodedGeometryType> _statusor69;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  long local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  StatusOr<draco::EncodedGeometryType> local_50;
  
  GetEncodedGeometryType(&local_50,in_buffer);
  if (local_50.status_.code_ == OK) {
    if (local_50.value_ == TRIANGULAR_MESH) {
      this_00 = (Mesh *)operator_new(0xd8);
      Mesh::Mesh(this_00);
      DecodeBufferToGeometry((Status *)local_98,this,in_buffer,this_00);
      if (local_98._0_4_ == OK) {
LAB_0011da1b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_p != &local_80) {
          operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
        }
        (__return_storage_ptr__->status_).code_ = OK;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
        (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
        super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
        super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = &this_00->super_PointCloud;
        goto LAB_0011da54;
      }
      (__return_storage_ptr__->status_).code_ = local_98._0_4_;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->status_).error_msg_,local_90._M_p,
                 local_90._M_p + local_88);
    }
    else {
      if (local_50.value_ != POINT_CLOUD) {
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Unsupported geometry type.","");
        local_98._0_4_ = DRACO_ERROR;
        local_90._M_p = (pointer)&local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_70,local_70->_M_local_buf + local_68);
        (__return_storage_ptr__->status_).code_ = local_98._0_4_;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__return_storage_ptr__->status_).error_msg_,local_90._M_p,
                   local_90._M_p + local_88);
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
        super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
        super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = (PointCloud *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_p != &local_80) {
          operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
        }
        _Var1._M_p = (pointer)local_70;
        if (local_70 == &local_60) goto LAB_0011da54;
        goto LAB_0011d88a;
      }
      this_00 = (Mesh *)operator_new(0xa8);
      PointCloud::PointCloud((PointCloud *)this_00);
      DecodeBufferToGeometry((Status *)local_98,this,in_buffer,(PointCloud *)this_00);
      if (local_98._0_4_ == OK) goto LAB_0011da1b;
      (__return_storage_ptr__->status_).code_ = local_98._0_4_;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->status_).error_msg_,local_90._M_p,
                 local_90._M_p + local_88);
    }
    (__return_storage_ptr__->value_)._M_t.
    super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
    super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
    super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = (PointCloud *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    (*(this_00->super_PointCloud)._vptr_PointCloud[1])(this_00);
  }
  else {
    local_98._0_4_ = local_50.status_.code_;
    local_90._M_p = (pointer)&local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_50.status_.error_msg_._M_dataplus._M_p,
               local_50.status_.error_msg_._M_dataplus._M_p +
               local_50.status_.error_msg_._M_string_length);
    (__return_storage_ptr__->status_).code_ = local_98._0_4_;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->status_).error_msg_,local_90._M_p,
               local_90._M_p + local_88);
    (__return_storage_ptr__->value_)._M_t.
    super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
    super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
    super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = (PointCloud *)0x0;
    local_60._M_allocated_capacity = local_80._M_allocated_capacity;
    _Var1._M_p = local_90._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p == &local_80) goto LAB_0011da54;
LAB_0011d88a:
    operator_delete(_Var1._M_p,local_60._M_allocated_capacity + 1);
  }
LAB_0011da54:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.status_.error_msg_._M_dataplus._M_p != &local_50.status_.error_msg_.field_2) {
    operator_delete(local_50.status_.error_msg_._M_dataplus._M_p,
                    local_50.status_.error_msg_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<PointCloud>> Decoder::DecodePointCloudFromBuffer(
    DecoderBuffer *in_buffer) {
  DRACO_ASSIGN_OR_RETURN(EncodedGeometryType type,
                         GetEncodedGeometryType(in_buffer))
  if (type == POINT_CLOUD) {
#ifdef DRACO_POINT_CLOUD_COMPRESSION_SUPPORTED
    std::unique_ptr<PointCloud> point_cloud(new PointCloud());
    DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, point_cloud.get()))
    return std::move(point_cloud);
#endif
  } else if (type == TRIANGULAR_MESH) {
#ifdef DRACO_MESH_COMPRESSION_SUPPORTED
    std::unique_ptr<Mesh> mesh(new Mesh());
    DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, mesh.get()))
    return static_cast<std::unique_ptr<PointCloud>>(std::move(mesh));
#endif
  }
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
}